

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v128 __thiscall simd_test_sse2::c_imm_v128_shr_n_s8<1>(simd_test_sse2 *this,c_v128 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  c_v128 cVar3;
  
  auVar1._0_2_ = a.u16[0] >> 1;
  auVar1._2_2_ = a.u16[1] >> 1;
  auVar1._4_2_ = a.u16[2] >> 1;
  auVar1._6_2_ = a.u16[3] >> 1;
  auVar1._8_8_ = 0;
  auVar1 = auVar1 & _DAT_00beb0d0 ^ _DAT_00beb1c0;
  cVar3.u8[9] = auVar1[1] - DAT_00beb1c0._1_1_;
  cVar3.u8[8] = auVar1[0] - DAT_00beb1c0;
  cVar3.u8[10] = auVar1[2] - DAT_00beb1c0._2_1_;
  cVar3.u8[0xb] = auVar1[3] - DAT_00beb1c0._3_1_;
  cVar3.u8[0xc] = auVar1[4] - DAT_00beb1c0._4_1_;
  cVar3.u8[0xd] = auVar1[5] - DAT_00beb1c0._5_1_;
  cVar3.u8[0xe] = auVar1[6] - DAT_00beb1c0._6_1_;
  cVar3.u8[0xf] = auVar1[7] - DAT_00beb1c0._7_1_;
  auVar2._0_2_ = (ushort)this >> 1;
  auVar2._2_2_ = (ushort)((ulong)this >> 0x10) >> 1;
  auVar2._4_2_ = (ushort)((ulong)this >> 0x20) >> 1;
  auVar2._6_2_ = (ushort)((ulong)this >> 0x31);
  auVar2._8_8_ = 0;
  auVar1 = auVar2 & _DAT_00beb0d0 ^ _DAT_00beb1c0;
  cVar3.u8[1] = auVar1[1] - DAT_00beb1c0._1_1_;
  cVar3.u8[0] = auVar1[0] - DAT_00beb1c0;
  cVar3.u8[2] = auVar1[2] - DAT_00beb1c0._2_1_;
  cVar3.u8[3] = auVar1[3] - DAT_00beb1c0._3_1_;
  cVar3.u8[4] = auVar1[4] - DAT_00beb1c0._4_1_;
  cVar3.u8[5] = auVar1[5] - DAT_00beb1c0._5_1_;
  cVar3.u8[6] = auVar1[6] - DAT_00beb1c0._6_1_;
  cVar3.u8[7] = auVar1[7] - DAT_00beb1c0._7_1_;
  return cVar3;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined s8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = a.s8[c] >> n;
  return t;
}